

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall
cmMakefile::AddSubDirectory
          (cmMakefile *this,string *srcPath,string *binPath,bool excludeFromAll,bool immediate)

{
  pointer *pppcVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__;
  iterator __position;
  bool bVar2;
  cmMakefile *this_00;
  cmMakefile *subMf;
  cmStateSnapshot newSnapshot;
  cmMakefile *local_78;
  undefined1 local_70 [16];
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> local_60;
  
  bVar2 = EnforceUniqueDir(this,srcPath,binPath);
  if (bVar2) {
    __return_storage_ptr__ = &local_60.UpPositions;
    cmState::CreateBuildsystemDirectorySnapshot
              ((cmStateSnapshot *)__return_storage_ptr__,this->GlobalGenerator->CMakeInstance->State
               ,&this->StateSnapshot);
    cmStateSnapshot::GetDirectory
              ((cmStateDirectory *)local_70,(cmStateSnapshot *)__return_storage_ptr__);
    cmStateDirectory::SetCurrentSource((cmStateDirectory *)local_70,srcPath);
    cmStateSnapshot::GetDirectory
              ((cmStateDirectory *)local_70,(cmStateSnapshot *)__return_storage_ptr__);
    cmStateDirectory::SetCurrentBinary((cmStateDirectory *)local_70,binPath);
    cmsys::SystemTools::MakeDirectory((binPath->_M_dataplus)._M_p);
    this_00 = (cmMakefile *)operator_new(0x760);
    cmMakefile(this_00,this->GlobalGenerator,(cmStateSnapshot *)__return_storage_ptr__);
    local_78 = this_00;
    cmGlobalGenerator::AddMakefile(this->GlobalGenerator,this_00);
    if (excludeFromAll) {
      local_70._0_8_ = &local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"EXCLUDE_FROM_ALL","");
      SetProperty(this_00,(string *)local_70,"TRUE");
      if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_70._0_8_ != &local_60)
      {
        operator_delete((void *)local_70._0_8_,
                        (ulong)((long)local_60.Data.
                                      super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1));
      }
    }
    if (immediate) {
      ConfigureSubDirectory(this,this_00);
    }
    else {
      __position._M_current =
           (this->UnConfiguredDirectories).
           super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->UnConfiguredDirectories).
          super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<cmMakefile*,std::allocator<cmMakefile*>>::_M_realloc_insert<cmMakefile*const&>
                  ((vector<cmMakefile*,std::allocator<cmMakefile*>> *)&this->UnConfiguredDirectories
                   ,__position,&local_78);
      }
      else {
        *__position._M_current = this_00;
        pppcVar1 = &(this->UnConfiguredDirectories).
                    super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppcVar1 = *pppcVar1 + 1;
      }
    }
  }
  return;
}

Assistant:

void cmMakefile::AddSubDirectory(const std::string& srcPath,
                                 const std::string& binPath,
                                 bool excludeFromAll, bool immediate)
{
  // Make sure the binary directory is unique.
  if (!this->EnforceUniqueDir(srcPath, binPath)) {
    return;
  }

  cmStateSnapshot newSnapshot =
    this->GetState()->CreateBuildsystemDirectorySnapshot(this->StateSnapshot);

  newSnapshot.GetDirectory().SetCurrentSource(srcPath);
  newSnapshot.GetDirectory().SetCurrentBinary(binPath);

  cmSystemTools::MakeDirectory(binPath.c_str());

  cmMakefile* subMf = new cmMakefile(this->GlobalGenerator, newSnapshot);
  this->GetGlobalGenerator()->AddMakefile(subMf);

  if (excludeFromAll) {
    subMf->SetProperty("EXCLUDE_FROM_ALL", "TRUE");
  }

  if (immediate) {
    this->ConfigureSubDirectory(subMf);
  } else {
    this->UnConfiguredDirectories.push_back(subMf);
  }
}